

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTargetIncludeDirectoriesCommand.cxx
# Opt level: O2

bool __thiscall
cmTargetIncludeDirectoriesCommand::InitialPass
          (cmTargetIncludeDirectoriesCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  bool bVar1;
  allocator local_39;
  string local_38;
  
  std::__cxx11::string::string((string *)&local_38,"INCLUDE_DIRECTORIES",&local_39);
  bVar1 = cmTargetPropCommandBase::HandleArguments
                    (&this->super_cmTargetPropCommandBase,args,&local_38,
                     PROCESS_SYSTEM|PROCESS_BEFORE);
  std::__cxx11::string::~string((string *)&local_38);
  return bVar1;
}

Assistant:

bool cmTargetIncludeDirectoriesCommand::InitialPass(
  std::vector<std::string> const& args, cmExecutionStatus&)
{
  return this->HandleArguments(args, "INCLUDE_DIRECTORIES",
                               ArgumentFlags(PROCESS_BEFORE | PROCESS_SYSTEM));
}